

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::NameResolver::OnReturnCallIndirectExpr
          (NameResolver *this,ReturnCallIndirectExpr *expr)

{
  if ((expr->decl).has_func_type == true) {
    ResolveVar(this,&this->current_module_->type_bindings,&(expr->decl).type_var,"type");
  }
  ResolveVar(this,&this->current_module_->table_bindings,&expr->table,"table");
  return (Result)Ok;
}

Assistant:

Result NameResolver::OnReturnCallIndirectExpr(ReturnCallIndirectExpr* expr) {
  if (expr->decl.has_func_type) {
    ResolveFuncTypeVar(&expr->decl.type_var);
  }
  ResolveTableVar(&expr->table);
  return Result::Ok;
}